

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O2

void __thiscall QFileSystemEntry::findFileNameSeparators(QFileSystemEntry *this)

{
  char16_t cVar1;
  char16_t *pcVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  short sVar9;
  uint uVar11;
  uint uVar10;
  
  if (this->m_firstDotInFileName == -2) {
    resolveFilePath(this);
    uVar7._0_2_ = this->m_lastSeparator;
    uVar7._2_2_ = this->m_firstDotInFileName;
    sVar9 = -1;
    if (-1 < (short)(undefined2)uVar7) {
      sVar9 = (undefined2)uVar7;
    }
    uVar10 = (uint)sVar9;
    uVar6 = 0;
    if (0 < (short)(undefined2)uVar7) {
      uVar6 = uVar7;
    }
    pcVar2 = (this->m_filePath).d.ptr;
    uVar7 = (uint)(this->m_filePath).d.size;
    do {
      uVar4 = uVar7 - 1;
      if ((int)uVar4 < (int)(uVar6 & 0xffff)) {
        uVar4 = 0xffffffff;
LAB_0010de37:
        uVar8 = uVar10;
        uVar11 = uVar4;
        if (uVar10 + 1 != uVar7) {
          for (uVar7 = uVar7 - 2;
              (uVar8 = uVar10, (int)(uVar6 & 0xffff) <= (int)uVar7 &&
              ((cVar1 = pcVar2[uVar7], uVar3 = uVar7, cVar1 == L'.' ||
               (uVar8 = uVar7, uVar3 = uVar11, cVar1 != L'/')))); uVar7 = uVar7 - 1) {
            uVar11 = uVar3;
          }
        }
        this->m_lastSeparator = (qint16)uVar8;
        uVar7 = 0;
        if (0 < (int)uVar8) {
          uVar7 = uVar8;
        }
        sVar9 = -1;
        if (uVar11 != 0xffffffff) {
          sVar9 = (short)uVar11 - (short)uVar7;
        }
        this->m_firstDotInFileName = sVar9;
        if (uVar4 == 0xffffffff) goto LAB_0010dea2;
        iVar5 = uVar4 - uVar11;
        if (iVar5 == 0) {
          iVar5 = 0;
        }
        goto LAB_0010dea6;
      }
      cVar1 = pcVar2[uVar4];
      if (cVar1 == L'.') goto LAB_0010de37;
      uVar7 = uVar4;
    } while (cVar1 != L'/');
    this->m_lastSeparator = (qint16)uVar4;
    this->m_firstDotInFileName = -1;
LAB_0010dea2:
    iVar5 = 0xffff;
LAB_0010dea6:
    this->m_lastDotInFileName = (qint16)iVar5;
  }
  return;
}

Assistant:

void QFileSystemEntry::findFileNameSeparators() const
{
    if (m_firstDotInFileName == Uninitialized) {
        resolveFilePath();
        int firstDotInFileName = -1;
        int lastDotInFileName = -1;
        int lastSeparator = m_lastSeparator;

        int stop;
        if (lastSeparator < 0) {
            lastSeparator = -1;
            stop = 0;
        } else {
            stop = lastSeparator;
        }

        int i = m_filePath.size() - 1;
        for (; i >= stop; --i) {
            if (m_filePath.at(i).unicode() == '.') {
                firstDotInFileName = lastDotInFileName = i;
                break;
            } else if (m_filePath.at(i).unicode() == '/') {
                lastSeparator = i;
                break;
            }
        }

        if (lastSeparator != i) {
            for (--i; i >= stop; --i) {
                if (m_filePath.at(i).unicode() == '.')
                    firstDotInFileName = i;
                else if (m_filePath.at(i).unicode() == '/') {
                    lastSeparator = i;
                    break;
                }
            }
        }
        m_lastSeparator = lastSeparator;
        m_firstDotInFileName = firstDotInFileName == -1 ? -1 : firstDotInFileName - qMax(0, lastSeparator);
        if (lastDotInFileName == -1)
            m_lastDotInFileName = -1;
        else if (firstDotInFileName == lastDotInFileName)
            m_lastDotInFileName = 0;
        else
            m_lastDotInFileName = lastDotInFileName - firstDotInFileName;
    }
}